

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_MonsterRail
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  AActor *other;
  AActor *pAVar7;
  double x;
  PClass *pPVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  PClass *pPVar12;
  AActor *pAVar13;
  char *__assertion;
  bool bVar14;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  FRailParams p;
  FTranslatedLineTarget t;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      other = *(AActor **)&param->field_0;
      if (other != (AActor *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar9 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar9);
        }
        pPVar12 = (other->super_DThinker).super_DObject.Class;
        bVar14 = pPVar12 != (PClass *)0x0;
        if (pPVar12 != pPVar8 && bVar14) {
          do {
            pPVar12 = pPVar12->ParentClass;
            bVar14 = pPVar12 != (PClass *)0x0;
            if (pPVar12 == pPVar8) break;
          } while (pPVar12 != (PClass *)0x0);
        }
        if (!bVar14) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f4ea8;
        }
      }
      pAVar13 = (other->target).field_0.p;
      if (pAVar13 != (AActor *)0x0) {
        if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          uVar10 = (other->flags).Value;
          if ((uVar10 >> 0x1e & 1) != 0) {
            other->visdir = '\x01';
          }
          dVar1 = (other->Angles).Pitch.Degrees;
          (other->flags).Value = uVar10 & 0xffffffdf;
          pAVar13 = (other->target).field_0.p;
          if ((pAVar13 != (AActor *)0x0) &&
             (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (other->target).field_0.p = (AActor *)0x0;
            pAVar13 = (AActor *)0x0;
          }
          AActor::AngleTo((AActor *)&p,other,SUB81(pAVar13,0));
          (other->Angles).Yaw.Degrees = (double)p.source;
          local_d0 = (undefined1  [8])p.source;
          local_d8 = 0x404e000000000000;
          pAVar13 = (other->target).field_0.p;
          if ((pAVar13 != (AActor *)0x0) &&
             (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (other->target).field_0.p = (AActor *)0x0;
            pAVar13 = (AActor *)0x0;
          }
          P_AimLineAttack((AActor *)&p,(DAngle *)other,2048.0,(FTranslatedLineTarget *)local_d0,
                          (DAngle *)&t,(int)&local_d8,(AActor *)0x0,pAVar13);
          (other->Angles).Pitch.Degrees = (double)p.source;
          if (t.linetarget == (AActor *)0x0) {
            pAVar13 = (other->target).field_0.p;
            if ((pAVar13 != (AActor *)0x0) &&
               (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (other->target).field_0.p = (AActor *)0x0;
            }
            AActor::Vec2To((AActor *)&p,other);
            pAVar13 = (other->target).field_0.p;
            dVar2 = pAVar13->Height;
            dVar3 = (pAVar13->__Pos).Z;
            dVar4 = other->Height;
            dVar5 = (other->__Pos).Z;
            dVar6 = other->Floorclip;
            x = c_sqrt((double)CONCAT44(p._12_4_,p.damage) * (double)CONCAT44(p._12_4_,p.damage) +
                       (double)p.source * (double)p.source);
            dVar2 = c_atan2(((dVar2 * 0.5 + dVar3) - (dVar4 * 0.5 + dVar5)) - dVar6,x);
            (other->Angles).Pitch.Degrees = dVar2 * -57.29577951308232;
          }
          pAVar13 = (other->target).field_0.p;
          if ((pAVar13 != (AActor *)0x0) &&
             (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (other->target).field_0.p = (AActor *)0x0;
            pAVar13 = (AActor *)0x0;
          }
          pAVar7 = (other->target).field_0.p;
          AActor::AngleTo((AActor *)&p,other,(pAVar7->Vel).X * -3.0,(pAVar7->Vel).Y * -3.0,
                          SUB81(pAVar13,0));
          (other->Angles).Yaw.Degrees = (double)p.source;
          if ((((((other->target).field_0.p)->flags).Value & 0x40000) != 0) &&
             (((other->flags6).Value & 0x1000000) == 0)) {
            uVar10 = FRandom::GenRand32(&pr_railface);
            uVar11 = FRandom::GenRand32(&pr_railface);
            (other->Angles).Yaw.Degrees =
                 (double)(int)((uVar10 & 0xff) - (uVar11 & 0xff)) * 45.0 * 0.00390625 +
                 (other->Angles).Yaw.Degrees;
          }
          p.damage = 0;
          p.offset_xy = 0.0;
          p.offset_z = 0.0;
          p.color1 = 0;
          p.color2 = 0;
          p.maxdiff = 0.0;
          p.flags = 0;
          p.puff = (PClassActor *)0x0;
          p.angleoffset.Degrees = 0.0;
          p.pitchoffset.Degrees = 0.0;
          p.distance = 8192.0;
          p.duration = 0;
          p.sparsity = 1.0;
          p.drift = 1.0;
          p.spawnclass = (PClassActor *)0x0;
          p.SpiralOffset = 0x10e;
          p.limit = 0;
          p.source = other;
          p.damage = AActor::GetMissileDamage(other,0,1);
          P_RailAttack(&p);
          (other->Angles).Pitch.Degrees = dVar1;
        }
        else {
          (other->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f4ea8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc34,
                "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRail)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (!self->target)
		return 0;

	DAngle saved_pitch = self->Angles.Pitch;
	FTranslatedLineTarget t;

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;
		
	self->Angles.Yaw = self->AngleTo(self->target);

	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, self->target);
	if (t.linetarget == NULL)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}

	// Let the aim trail behind the player
	self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

	if (self->target->flags & MF_SHADOW && !(self->flags6 & MF6_SEEINVISIBLE))
	{
		self->Angles.Yaw += pr_railface.Random2() * 45./256;
	}

	FRailParams p;

	p.source = self;
	p.damage = self->GetMissileDamage(0, 1);
	P_RailAttack (&p);
	self->Angles.Pitch = saved_pitch;
	return 0;
}